

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O3

objc_property_t *
protocol_copyPropertyList2
          (Protocol *p,uint *outCount,BOOL isRequiredProperty,BOOL isInstanceProperty)

{
  int iVar1;
  objc_property_list *l;
  int *piVar2;
  objc_property_t *ppoVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  long lVar5;
  uint uVar6;
  objc_property_t poVar7;
  ulong uVar8;
  int *piVar9;
  
  if (p != (Protocol *)0x0) {
    piVar9 = *(int **)((long)&p->properties +
                      (ulong)((uint)((int)CONCAT71(in_register_00000009,isInstanceProperty) == 0) *
                              0x10 + (uint)((int)CONCAT71(in_register_00000011,isRequiredProperty)
                                           == 0) * 8));
    if (isRequiredProperty == '\0' && isInstanceProperty == '\0') {
      if ((objc_class *)p->isa == &_OBJC_CLASS_ProtocolGCC) {
        return (objc_property_t *)0x0;
      }
      if (piVar9 == (int *)0x0) {
        return (objc_property_t *)0x0;
      }
    }
    else if (piVar9 == (int *)0x0) {
      return (objc_property_t *)0x0;
    }
    uVar6 = 0;
    piVar2 = piVar9;
    do {
      uVar6 = uVar6 + *piVar2;
      piVar2 = *(int **)(piVar2 + 2);
    } while (piVar2 != (int *)0x0);
    if (uVar6 != 0) {
      ppoVar3 = (objc_property_t *)calloc(8,(ulong)uVar6);
      if (piVar9 != (int *)0x0) {
        uVar4 = 0;
        do {
          lVar5 = (long)*piVar9;
          if (0 < lVar5) {
            iVar1 = piVar9[1];
            if ((ulong)(long)iVar1 < 0x28) {
              __assert_fail("l->size >= sizeof(struct objc_property)",
                            "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/properties.h"
                            ,0xde,
                            "struct objc_property *property_at_index(struct objc_property_list *, int)"
                           );
            }
            poVar7 = (objc_property_t)(piVar9 + 4);
            do {
              uVar8 = (ulong)uVar4;
              uVar4 = uVar4 + 1;
              ppoVar3[uVar8] = poVar7;
              poVar7 = (objc_property_t)((long)&poVar7->name + (long)iVar1);
              lVar5 = lVar5 + -1;
            } while (lVar5 != 0);
          }
          piVar9 = *(int **)(piVar9 + 2);
        } while (piVar9 != (int *)0x0);
      }
      *outCount = uVar6;
      return ppoVar3;
    }
  }
  return (objc_property_t *)0x0;
}

Assistant:

objc_property_t *protocol_copyPropertyList2(Protocol *p, unsigned int *outCount,
		BOOL isRequiredProperty, BOOL isInstanceProperty)
{
	struct objc_property_list *properties =
	    isInstanceProperty ?
	        (isRequiredProperty ? p->properties : p->optional_properties) :
	        (isRequiredProperty ? p->class_properties : p->optional_class_properties);
	if (NULL == p) { return NULL; }
	// If it's an old protocol, it won't have any of the other options.
	if (!isRequiredProperty && !isInstanceProperty &&
	    !protocol_hasOptionalMethodsAndProperties(p))
	{
		return NULL;
	}
	if (properties == NULL)
	{
		return NULL;
	}
	unsigned int count = 0;
	for (struct objc_property_list *l=properties ; l!=NULL ; l=l->next)
	{
		count += l->count;
	}
	if (0 == count)
	{
		return NULL;
	}
	objc_property_t *list = calloc(sizeof(objc_property_t), count);
	unsigned int out = 0;
	for (struct objc_property_list *l=properties ; l!=NULL ; l=l->next)
	{
		for (int i=0 ; i<l->count ; i++)
		{
			list[out++] = property_at_index(l, i);
		}
	}
	*outCount = count;
	return list;
}